

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void arb1_MxXy(Context *ctx,int x,int y)

{
  char local_f8 [8];
  char row [64];
  char dst [64];
  int local_6c;
  char local_68 [4];
  int i;
  char src0 [64];
  int origmask;
  DestArgInfo *dstarg;
  int y_local;
  int x_local;
  Context *ctx_local;
  
  src0._60_4_ = (ctx->dest_arg).writemask;
  make_ARB1_srcarg_string(ctx,0,local_68,0x40);
  for (local_6c = 0; local_6c < y; local_6c = local_6c + 1) {
    make_ARB1_srcarg_string(ctx,(long)(local_6c + 1),local_f8,0x40);
    set_dstarg_writemask(&ctx->dest_arg,1 << ((byte)local_6c & 0x1f));
    make_ARB1_destarg_string(ctx,row + 0x38,0x40);
    output_line(ctx,"DP%d%s, %s, %s;",(ulong)(uint)x,row + 0x38,local_68,local_f8);
  }
  set_dstarg_writemask(&ctx->dest_arg,src0._60_4_);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_DS_FUNC(FRC)

static void arb1_MxXy(Context *ctx, const int x, const int y)
{
    DestArgInfo *dstarg = &ctx->dest_arg;
    const int origmask = dstarg->writemask;
    char src0[64];
    int i;

    make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    for (i = 0; i < y; i++)
    {
        char dst[64];
        char row[64];
        make_ARB1_srcarg_string(ctx, i + 1, row, sizeof (row));
        set_dstarg_writemask(dstarg, 1 << i);
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        output_line(ctx, "DP%d%s, %s, %s;", x, dst, src0, row);
    } // for

    set_dstarg_writemask(dstarg, origmask);
    emit_ARB1_dest_modifiers(ctx);
}